

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_ModRM.c
# Opt level: O3

void Addr_ECX_disp32(OPTYPE *pMyOperand,PDISASM pMyDisasm)

{
  UIntPtr UVar1;
  size_t sVar2;
  size_t i;
  long MyNumber;
  
  UVar1 = (pMyDisasm->Reserved_).EIP_;
  if ((pMyDisasm->Reserved_).AddressSize == 0x10) {
    MyNumber = (long)*(short *)(UVar1 + 2);
  }
  else {
    MyNumber = (long)*(int *)(UVar1 + 2);
  }
  (pMyOperand->Memory).Displacement = MyNumber;
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    sVar2 = printDisp32(pMyOperand,0,pMyDisasm,MyNumber);
    (pMyOperand->OpMnemonic + sVar2)[0] = '(';
    (pMyOperand->OpMnemonic + sVar2)[1] = '%';
    pMyOperand->OpMnemonic[sVar2 + 2] = '\0';
    sVar2 = sVar2 + 2;
  }
  else {
    sVar2 = 0;
  }
  fillModrm0Register(pMyOperand,pMyDisasm,sVar2,'\x01');
  if ((pMyDisasm->Reserved_).AddressSize == 0x10) {
    (pMyOperand->Memory).BaseRegister = REGS[3];
    (pMyOperand->Memory).IndexRegister = REGS[7];
  }
  i = strlen(pMyOperand->OpMnemonic);
  if ((pMyDisasm->Reserved_).SYNTAX_ == 0x400) {
    (pMyOperand->OpMnemonic + i)[0] = ')';
    (pMyOperand->OpMnemonic + i)[1] = '\0';
    return;
  }
  printDisp32(pMyOperand,i,pMyDisasm,MyNumber);
  return;
}

Assistant:

void __bea_callspec__ Addr_ECX_disp32(OPTYPE* pMyOperand, PDISASM pMyDisasm)
{
    size_t i = 0;
    long MyNumber;
    if (GV.AddressSize == 16) {
        MyNumber = *((Int16*) (GV.EIP_+2));
    }
    else{
        MyNumber = *((Int32*) (GV.EIP_+2));
    }
    pMyOperand->Memory.Displacement = MyNumber;
    if (GV.SYNTAX_ == ATSyntax) {
        i = printDisp32(pMyOperand, i, pMyDisasm, MyNumber);
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy((char*) pMyOperand->OpMnemonic+i, "(%");
        #endif
        i+=2;
    }
    fillModrm0Register(pMyOperand, pMyDisasm, i, 1);
    if (GV.AddressSize == 16) {
      pMyOperand->Memory.BaseRegister = REGS[3];
      pMyOperand->Memory.IndexRegister = REGS[7];
    }
    i = strlen ((char*) &pMyOperand->OpMnemonic);
    if (GV.SYNTAX_ == ATSyntax) {
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy((char*) pMyOperand->OpMnemonic+i, ")");
        i += 1;
      #endif
    }
    else {
      i = printDisp32(pMyOperand, i, pMyDisasm, MyNumber);
    }
}